

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.cpp
# Opt level: O2

uhugeint_t
duckdb::BitwiseShiftLeftOperator::
Operation<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
          (uhugeint_t input,uhugeint_t shift)

{
  uhugeint_t value;
  uhugeint_t value_00;
  uhugeint_t value_01;
  uhugeint_t value_02;
  uhugeint_t value_03;
  bool bVar1;
  OutOfRangeException *pOVar2;
  uhugeint_t shift_local;
  string local_158;
  uhugeint_t input_local;
  uhugeint_t local_128;
  uhugeint_t max_value;
  uhugeint_t max_shift;
  uhugeint_t local_f8;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  uhugeint_t local_48;
  uhugeint_t local_38;
  
  shift_local.upper = shift.upper;
  shift_local.lower = shift.lower;
  input_local.upper = input.upper;
  input_local.lower = input.lower;
  uhugeint_t::uhugeint_t((uhugeint_t *)&local_158,0x80);
  uhugeint_t::uhugeint_t(&max_value,1);
  max_shift = uhugeint_t::operator+((uhugeint_t *)&local_158,&max_value);
  uhugeint_t::uhugeint_t((uhugeint_t *)&local_158,0);
  bVar1 = uhugeint_t::operator<(&input_local,(uhugeint_t *)&local_158);
  if (bVar1) {
    pOVar2 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_158,"Cannot left-shift negative number %s",(allocator *)&max_value);
    value_02.upper = input_local.upper;
    value_02.lower = input_local.lower;
    NumericHelper::ToString<duckdb::uhugeint_t>(&local_68,value_02);
    OutOfRangeException::OutOfRangeException<std::__cxx11::string>(pOVar2,&local_158,&local_68);
    __cxa_throw(pOVar2,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  uhugeint_t::uhugeint_t((uhugeint_t *)&local_158,0);
  bVar1 = uhugeint_t::operator<(&shift_local,(uhugeint_t *)&local_158);
  if (!bVar1) {
    bVar1 = uhugeint_t::operator>=(&shift_local,&max_shift);
    if (bVar1) {
      uhugeint_t::uhugeint_t((uhugeint_t *)&local_158,0);
      bVar1 = uhugeint_t::operator==(&input_local,(uhugeint_t *)&local_158);
      if (!bVar1) {
        pOVar2 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_158,"Left-shift value %s is out of range",
                   (allocator *)&max_value);
        value_00.upper = shift_local.upper;
        value_00.lower = shift_local.lower;
        NumericHelper::ToString<duckdb::uhugeint_t>(&local_a8,value_00);
        OutOfRangeException::OutOfRangeException<std::__cxx11::string>(pOVar2,&local_158,&local_a8);
        __cxa_throw(pOVar2,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
      uhugeint_t::uhugeint_t(&local_128,0);
    }
    else {
      uhugeint_t::uhugeint_t((uhugeint_t *)&local_158,0);
      bVar1 = uhugeint_t::operator==(&shift_local,(uhugeint_t *)&local_158);
      if (bVar1) {
        local_128.upper = input_local.upper;
        local_128.lower = input_local.lower;
      }
      else {
        uhugeint_t::uhugeint_t((uhugeint_t *)&local_158,1);
        local_38 = uhugeint_t::operator-(&max_shift,&shift_local);
        uhugeint_t::uhugeint_t(&local_48,1);
        local_f8 = uhugeint_t::operator-(&local_38,&local_48);
        max_value = uhugeint_t::operator<<((uhugeint_t *)&local_158,&local_f8);
        bVar1 = uhugeint_t::operator>=(&input_local,&max_value);
        if (bVar1) {
          pOVar2 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_158,"Overflow in left shift (%s << %s)",(allocator *)&local_f8
                    );
          value_03.upper = input_local.upper;
          value_03.lower = input_local.lower;
          NumericHelper::ToString<duckdb::uhugeint_t>(&local_c8,value_03);
          value_01.upper = shift_local.upper;
          value_01.lower = shift_local.lower;
          NumericHelper::ToString<duckdb::uhugeint_t>(&local_e8,value_01);
          OutOfRangeException::OutOfRangeException<std::__cxx11::string,std::__cxx11::string>
                    (pOVar2,&local_158,&local_c8,&local_e8);
          __cxa_throw(pOVar2,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_128 = uhugeint_t::operator<<(&input_local,&shift_local);
      }
    }
    return local_128;
  }
  pOVar2 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_158,"Cannot left-shift by negative number %s",(allocator *)&max_value)
  ;
  value.upper = shift_local.upper;
  value.lower = shift_local.lower;
  NumericHelper::ToString<duckdb::uhugeint_t>(&local_88,value);
  OutOfRangeException::OutOfRangeException<std::__cxx11::string>(pOVar2,&local_158,&local_88);
  __cxa_throw(pOVar2,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA input, TB shift) {
		TA max_shift = TA(sizeof(TA) * 8) + (NumericLimits<TA>::IsSigned() ? 0 : 1);
		if (input < 0) {
			throw OutOfRangeException("Cannot left-shift negative number %s", NumericHelper::ToString(input));
		}
		if (shift < 0) {
			throw OutOfRangeException("Cannot left-shift by negative number %s", NumericHelper::ToString(shift));
		}
		if (shift >= max_shift) {
			if (input == 0) {
				return 0;
			}
			throw OutOfRangeException("Left-shift value %s is out of range", NumericHelper::ToString(shift));
		}
		if (shift == 0) {
			return input;
		}
		TA max_value = UnsafeNumericCast<TA>((TA(1) << (max_shift - shift - 1)));
		if (input >= max_value) {
			throw OutOfRangeException("Overflow in left shift (%s << %s)", NumericHelper::ToString(input),
			                          NumericHelper::ToString(shift));
		}
		return UnsafeNumericCast<TR>(input << shift);
	}